

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

int adios2::utils::printVariableInfo<double>(Engine *fp,IO *io,Variable<double> *variable)

{
  FILE *pFVar1;
  char cVar2;
  ulong uVar3;
  DataType adiosvartype;
  int iVar4;
  size_t j_1;
  ulong uVar5;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *this;
  Variable<double> *data;
  size_t j;
  double value;
  undefined1 local_80 [24];
  Engine *local_68;
  IO *local_60;
  DataType local_54;
  Dims d;
  
  data = (Variable<double> *)&value;
  uVar3 = adios2::core::VariableBase::GetAvailableStepsCount();
  uVar5 = 1;
  if (timestep == '\0') {
    uVar5 = uVar3;
  }
  adiosvartype = *(DataType *)(variable + 0x28);
  if (((uVar5 == 1) && (variable[0x54] != (Variable<double>)0x0)) &&
     (*(int *)(variable + 0x40) != 2)) {
    fwrite("  scalar",8,1,outf);
    if ((longopt != '\x01') || (timestep != '\0')) goto LAB_00120b50;
    fwrite(" = ",3,1,outf);
    adios2::core::Engine::Get<double>((Variable *)fp,(double *)variable,(Mode)&value);
  }
  else {
    uVar3 = 1;
    local_54 = adiosvartype;
    fwrite("  ",2,1,outf);
    if (1 < uVar5) {
      fprintf(outf,"%zu*",uVar5);
    }
    if (*(int *)(variable + 0x40) == 5) {
      get_local_array_signature<double>
                ((pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )&value,fp,io,variable);
      pFVar1 = outf;
      if (value == 0.0) {
        fprintf(outf,"[%s]*","__");
      }
      else {
        std::__cxx11::to_string((string *)&d,(unsigned_long)value);
        fprintf(pFVar1,"[%s]*",
                d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&d);
      }
      pFVar1 = outf;
      if (*(unsigned_long *)local_80._0_8_ == 0) {
        local_68 = fp;
        local_60 = io;
        fprintf(outf,"{%s","__");
      }
      else {
        local_68 = fp;
        local_60 = io;
        std::__cxx11::to_string((string *)&d,*(unsigned_long *)local_80._0_8_);
        fprintf(pFVar1,"{%s",
                d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&d);
      }
      for (uVar5 = 1; pFVar1 = outf,
          uVar5 < (ulong)(*(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3);
          uVar5 = uVar5 + 1) {
        if (*(unsigned_long *)(local_80._0_8_ + uVar5 * 8) == 0) {
          fprintf(outf,", %s","__");
        }
        else {
          std::__cxx11::to_string((string *)&d,*(unsigned_long *)(local_80._0_8_ + uVar5 * 8));
          fprintf(pFVar1,", %s",
                  d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start);
          std::__cxx11::string::~string((string *)&d);
        }
      }
      fputc(0x7d,outf);
      this = (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_80;
LAB_00120a79:
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(this);
      io = local_60;
      fp = local_68;
    }
    else {
      if (*(int *)(variable + 0x40) == 2) {
        local_68 = fp;
        get_global_array_signature<double>(&d,fp,io,variable);
        pFVar1 = outf;
        if (*d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start == 0) {
          local_60 = io;
          fprintf(outf,"{%s","__");
        }
        else {
          local_60 = io;
          std::__cxx11::to_string
                    ((string *)&value,
                     *d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
          fprintf(pFVar1,"{%s",value);
          std::__cxx11::string::~string((string *)&value);
        }
        for (; pFVar1 = outf,
            uVar3 < (ulong)(*(long *)(variable + 0x60) - *(long *)(variable + 0x58) >> 3);
            uVar3 = uVar3 + 1) {
          if (d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3] == 0) {
            fprintf(outf,", %s","__");
          }
          else {
            std::__cxx11::to_string
                      ((string *)&value,
                       d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar3]);
            fprintf(pFVar1,", %s",value);
            std::__cxx11::string::~string((string *)&value);
          }
        }
        fputc(0x7d,outf);
        this = &d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
        goto LAB_00120a79;
      }
      fwrite("scalar",6,1,outf);
    }
    adiosvartype = local_54;
    if ((longopt != '\x01') || (timestep != '\0')) goto LAB_00120b50;
    cVar2 = (**(code **)(*(long *)fp + 0x70))(fp,variable,0xffffffffffffffff,&value);
    fwrite(" = ",3,1,outf);
    if (cVar2 == '\0') {
      print_data(variable + 0x228,0,adiosvartype,false,false);
      fwrite(" / ",3,1,outf);
      data = variable + 0x230;
    }
    else {
      print_data(&value,0,adiosvartype,false,false);
      fwrite(" / ",3,1,outf);
      data = (Variable<double> *)(local_80 + 8);
    }
  }
  print_data(data,0,adiosvartype,false,false);
LAB_00120b50:
  fputc(10,outf);
  if (show_decomp == '\x01') {
    if (timestep == '\x01') {
      print_decomp_singlestep<double>(fp,io,variable);
    }
    else {
      print_decomp<double>(fp,io,variable);
    }
  }
  if (show_derived_expr == '\x01') {
    (**(code **)(*(long *)fp + 0x78))(&value,fp,variable);
    if ((unsigned_long *)local_80._0_8_ != (unsigned_long *)0x0) {
      fprintf(outf,"    Derived variable with expression: %s\n",value);
    }
    std::__cxx11::string::~string((string *)&value);
  }
  iVar4 = 0;
  if ((dump == '\x01') && (iVar4 = 0, show_decomp == '\0')) {
    adios2::core::VariableBase::SetAccuracy((Accuracy *)variable);
    if (*(int *)(variable + 0x40) == 5) {
      if (timestep == '\x01') {
        print_decomp_singlestep<double>(fp,io,variable);
      }
      else {
        print_decomp<double>(fp,io,variable);
      }
      iVar4 = 0;
    }
    else {
      iVar4 = readVar<double>(fp,io,variable);
    }
    fputc(10,outf);
  }
  return iVar4;
}

Assistant:

int printVariableInfo(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    size_t nsteps = variable->GetAvailableStepsCount();
    if (timestep)
    {
        nsteps = 1;
    }
    DataType adiosvartype = variable->m_Type;
    int retval = 0;

    bool isGlobalValue = (nsteps == 1);
    isGlobalValue &= variable->m_SingleValue;
    isGlobalValue &= (variable->m_ShapeID != ShapeID::GlobalArray);

    if (!isGlobalValue)
    {
        fprintf(outf, "  ");

        if (nsteps > 1)
            fprintf(outf, "%zu*", nsteps);

        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            Dims d = get_global_array_signature(fp, io, variable);
            fprintf(outf, "{%s", d[0] > 0 ? std::to_string(d[0]).c_str() : "__");
            for (size_t j = 1; j < variable->m_Shape.size(); j++)
            {
                fprintf(outf, ", %s", d[j] > 0 ? std::to_string(d[j]).c_str() : "__");
            }
            fprintf(outf, "}");
        }
        else if (variable->m_ShapeID == ShapeID::LocalArray)
        {
            std::pair<size_t, Dims> signo = get_local_array_signature(fp, io, variable);
            Dims &d = signo.second;
            fprintf(outf, "[%s]*", signo.first > 0 ? std::to_string(signo.first).c_str() : "__");
            fprintf(outf, "{%s", d[0] > 0 ? std::to_string(d[0]).c_str() : "__");
            for (size_t j = 1; j < variable->m_Count.size(); j++)
            {
                fprintf(outf, ", %s", d[j] > 0 ? std::to_string(d[j]).c_str() : "__");
            }
            fprintf(outf, "}");
        }
        else
        {
            fprintf(outf, "scalar");
        }
#if 0
        if (longopt || plot)
        {
            adios_inq_var_stat(fp, vi, timestep && timed, show_decomp);
        }

        if (plot && vi->statistics && vi->statistics->histogram)
        {
            print_data_hist(vi, &names[n][1]);
        }
#endif
        if (longopt /* TODO: && variable->has_statistics */)
        {
            if (timestep == false)
            {
                MinMaxStruct MinMax;
                try
                {
                    if (fp->VariableMinMax(*variable, DefaultSizeT, MinMax))
                    {
                        fprintf(outf, " = ");
                        print_data(&MinMax.MinUnion, 0, adiosvartype, false);
                        fprintf(outf, " / ");
                        print_data(&MinMax.MaxUnion, 0, adiosvartype, false);
                    }
                    else
                    {
                        fprintf(outf, " = ");
                        print_data(&variable->m_Min, 0, adiosvartype, false);
                        fprintf(outf, " / ");
                        print_data(&variable->m_Max, 0, adiosvartype, false);
                    }
                    // fprintf(outf," {MIN / MAX} ");
                }
                catch (std::logic_error &)
                {
                }
            }
#if 0
            else
            {
                int time_start = 0, time_end = vi->nsteps;

                if (start != NULL)
                {
                    if (istart[0] >= 0)
                        time_start = istart[0];
                    else
                        time_start = vi->nsteps - 1 + (int)istart[0];
                }

                if (count != NULL)
                {
                    if (icount[0] > 0)
                        time_end = time_start + (int)icount[0];
                    else
                        time_end = vi->nsteps + (int)icount[0] + 1;
                }

                if (time_start < 0 || time_start >= vi->nsteps)
                {
                    fprintf(stderr, "Error when reading variable %s. "
                                    "errno=%d : Variable (id=%d) has "
                                    "no data at %d time step\n",
                            names[n], 15, vi->varid, time_start);
                    bpexit(15, fp);
                }

                if (time_end < 0 || time_end > vi->nsteps)
                {
                    fprintf(stderr, "Error when reading variable %s. "
                                    "errno=%d : Variable (id=%d) has "
                                    "no data at %d time step\n",
                            names[n], 15, vi->varid, time_end);
                    bpexit(16, fp);
                }

                static char *indent_char = " ";
                int indent_len = 11;

                /* Start - Print the headers of statistics first */
                fprintf(outf, "\n%-*s", indent_len + 7, indent_char);
                fprintf(outf, "%10s  ", "MIN");
                fprintf(outf, "%10s  ", "MAX");
                fprintf(outf, "%10s  ", "AVG");
                fprintf(outf, "%10s  ", "STD DEV");

                /* End - Print the headers of statistics first */

                void *min, *max, *avg, *std_dev;
                DataType vt = vartype;
                struct ADIOS_STAT_STEP *s = vi->statistics->steps;
                if (vi->type == DataType::FloatComplex ||
                    vi->type == DataType::DoubleComplex)
                    vt = DataType::Double;
                fprintf(outf, "\n%-*sglobal:", indent_len, indent_char);
                print_data_characteristics(
                    vi->statistics->min, vi->statistics->max,
                    vi->statistics->avg, vi->statistics->std_dev, vt, false);

                for (i = time_start; i < time_end; i++)
                {
                    min = max = avg = std_dev = 0;
                    if (s->maxs && s->maxs[i])
                        max = s->maxs[i];
                    if (s->mins && s->mins[i])
                        min = s->mins[i];
                    if (s->avgs && s->avgs[i])
                        avg = s->avgs[i];
                    if (s->std_devs && s->std_devs[i])
                        std_dev = s->std_devs[i];

                    // Align the output, previous lines has atleast
                    // (maxlen + strlen(names[n])) characters
                    // Better way to printf N spaces?
                    fprintf(outf, "\n%-*st%-5d:", indent_len, indent_char, i);
                    print_data_characteristics(min, max, avg, std_dev, vt,
                                               false);
                }
                fprintf(outf, "\n");
            }
#endif
        } // longopt && vi->statistics
        fprintf(outf, "\n");

        if (show_decomp)
        {
            if (timestep)
            {
                print_decomp_singlestep(fp, io, variable);
            }
            else
            {
                print_decomp(fp, io, variable);
            }
        }
    }
    else
    {
        // single GlobalValue without timesteps
        fprintf(outf, "  scalar");
        if (longopt && !timestep)
        {
            fprintf(outf, " = ");
            T value;
            fp->Get(*variable, value, adios2::Mode::Sync);
            print_data(&value, 0, adiosvartype, false);
        }
        fprintf(outf, "\n");

        if (show_decomp)
        {
            if (timestep)
            {
                print_decomp_singlestep(fp, io, variable);
            }
            else
            {
                print_decomp(fp, io, variable);
            }
        }
    }

    if (show_derived_expr)
    {
        std::string ExprStr = fp->VariableExprStr(*variable);
        if (ExprStr.size() > 0)
        {
            fprintf(outf, "    Derived variable with expression: %s\n", ExprStr.c_str());
        }
    }

    if (dump && !show_decomp)
    {
        variable->SetAccuracy(accuracy);
        // print variable content
        if (variable->m_ShapeID == ShapeID::LocalArray)
        {
            if (timestep)
            {
                print_decomp_singlestep(fp, io, variable);
            }
            else
            {
                print_decomp(fp, io, variable);
            }
        }
        else
        {
            retval = readVar(fp, io, variable);
        }
        fprintf(outf, "\n");
    }
    return retval;
}